

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

bool Eval::initPatterns(void)

{
  byte bVar1;
  unsigned_short uVar2;
  bool bVar3;
  int local_64;
  int local_60;
  int k_1;
  int j_2;
  int i_3;
  int l;
  int k;
  int j_1;
  int i_2;
  int j;
  int i_1;
  int i;
  int offset;
  int tempOffset [11];
  
  deltaSum = (float *)0x0;
  occurance = (int *)0x0;
  patternValues = (int *)operator_new__(0xad8dc4);
  memset(myPV,0,0x2e000);
  memset(pPtr,0,0x17000);
  memset(pVCount,0,0x800);
  memset(posDepend,0,0x2e00);
  memset(patternDependCount,0,0xb8);
  i_1 = 0;
  for (j = 0; j < 0xb; j = j + 1) {
    (&i)[j] = i_1;
    i_1 = patternCount[j] + i_1;
  }
  for (i_2 = 0; i_2 < 0x11; i_2 = i_2 + 1) {
    for (j_1 = 0; j_1 < 0x2e; j_1 = j_1 + 1) {
      patternOffset[i_2][j_1] = i_2 * 0x28d61 + (&i)[patternPtr[j_1]];
    }
  }
  bVar3 = loadPatterns();
  if (bVar3) {
    addDependency(9,0);
    multipleAdd(0,1,8,0);
    addDependency(0xe,0);
    addDependency(0x31,1);
    multipleAdd(0x38,-8,8,1);
    addDependency(9,1);
    addDependency(0x36,2);
    multipleAdd(0x3f,-1,8,2);
    addDependency(0x31,2);
    addDependency(0xe,3);
    multipleAdd(7,8,8,3);
    addDependency(0x36,3);
    multipleAdd(8,1,8,4);
    multipleAdd(0x39,-8,8,5);
    multipleAdd(0x37,-1,8,6);
    multipleAdd(6,8,8,7);
    multipleAdd(0x10,1,8,8);
    multipleAdd(0x3a,-8,8,9);
    multipleAdd(0x2f,-1,8,10);
    multipleAdd(5,8,8,0xb);
    multipleAdd(0x18,1,8,0xc);
    multipleAdd(0x3b,-8,8,0xd);
    multipleAdd(0x27,-1,8,0xe);
    multipleAdd(4,8,8,0xf);
    multipleAdd(0,9,8,0x10);
    multipleAdd(0x38,-7,8,0x11);
    multipleAdd(8,9,7,0x12);
    multipleAdd(0x39,-7,7,0x13);
    multipleAdd(0x37,-9,7,0x14);
    multipleAdd(6,7,7,0x15);
    multipleAdd(0x10,9,6,0x16);
    multipleAdd(0x3a,-7,6,0x17);
    multipleAdd(0x2f,-9,6,0x18);
    multipleAdd(5,7,6,0x19);
    multipleAdd(0x18,9,5,0x1a);
    multipleAdd(0x3b,-7,5,0x1b);
    multipleAdd(0x27,-9,5,0x1c);
    multipleAdd(4,7,5,0x1d);
    multipleAdd(0x20,9,4,0x1e);
    multipleAdd(0x3c,-7,4,0x1f);
    multipleAdd(0x1f,-9,4,0x20);
    multipleAdd(3,7,4,0x21);
    multipleAdd(0,1,5,0x22);
    multipleAdd(8,1,5,0x22);
    multipleAdd(0x38,-8,5,0x23);
    multipleAdd(0x39,-8,5,0x23);
    multipleAdd(0x3f,-1,5,0x24);
    multipleAdd(0x37,-1,5,0x24);
    multipleAdd(7,8,5,0x25);
    multipleAdd(6,8,5,0x25);
    multipleAdd(0,8,5,0x26);
    multipleAdd(1,8,5,0x26);
    multipleAdd(0x38,1,5,0x27);
    multipleAdd(0x30,1,5,0x27);
    multipleAdd(0x3f,-8,5,0x28);
    multipleAdd(0x3e,-8,5,0x28);
    multipleAdd(7,-1,5,0x29);
    multipleAdd(0xf,-1,5,0x29);
    multipleAdd(0,1,3,0x2a);
    multipleAdd(8,1,3,0x2a);
    multipleAdd(0x10,1,3,0x2a);
    multipleAdd(0x38,-8,3,0x2b);
    multipleAdd(0x39,-8,3,0x2b);
    multipleAdd(0x3a,-8,3,0x2b);
    multipleAdd(0x3f,-1,3,0x2c);
    multipleAdd(0x37,-1,3,0x2c);
    multipleAdd(0x2f,-1,3,0x2c);
    multipleAdd(7,8,3,0x2d);
    multipleAdd(6,8,3,0x2d);
    multipleAdd(5,8,3,0x2d);
    for (k = 0; k < 0x100; k = k + 1) {
      for (l = 0; l < 8; l = l + 1) {
        if ((k & 1 << (7U - (char)l & 0x1f)) != 0) {
          for (i_3 = 0; i_3 < 8; i_3 = i_3 + 1) {
            for (j_2 = 0; j_2 < 0x2e; j_2 = j_2 + 1) {
              myPV[k][i_3][j_2] = myPV[k][i_3][j_2] + (short)posDepend[i_3 * 8 + l][j_2];
            }
          }
        }
      }
    }
    for (k_1 = 0; k_1 < 0x100; k_1 = k_1 + 1) {
      for (local_60 = 0; local_60 < 8; local_60 = local_60 + 1) {
        for (local_64 = 0; local_64 < 0x2e; local_64 = local_64 + 1) {
          if (myPV[k_1][local_60][local_64] != 0) {
            pPtr[k_1][local_60][pVCount[k_1][local_60]] = (uchar)local_64;
            uVar2 = myPV[k_1][local_60][local_64];
            bVar1 = pVCount[k_1][local_60];
            pVCount[k_1][local_60] = bVar1 + 1;
            myPV[k_1][local_60][bVar1] = uVar2;
          }
        }
      }
    }
    tempOffset[9]._3_1_ = true;
  }
  else {
    if (patternValues != (int *)0x0) {
      operator_delete__(patternValues);
    }
    patternValues = (int *)0x0;
    tempOffset[9]._3_1_ = false;
  }
  return tempOffset[9]._3_1_;
}

Assistant:

bool Eval::initPatterns() {
    deltaSum = 0;
    occurance = 0;
    patternValues = new int[ALL_STAGE_PATTERN_COUNT];

    memset(myPV, 0, sizeof(myPV));
    //memset(opPV, 0, sizeof(opPV));
    memset(pPtr, 0, sizeof(pPtr));
    memset(pVCount, 0, sizeof(pVCount));
    memset(posDepend, 0, sizeof(posDepend));
    memset(patternDependCount, 0, sizeof(patternDependCount));
    int tempOffset[PATTERNS];
    int offset = 0;
    for (int i = 0; i < PATTERNS; i++) {
        tempOffset[i] = offset;
        offset += patternCount[i];
    }
    for (int i = 0; i < STAGES; i++) {
        offset = i * TOTAL_PATTERN_COUNT;
        for (int j = 0; j < ACTUAL_PATTERNS; j++) {
            patternOffset[i][j] = offset + tempOffset[patternPtr[j]];
        }
    }
    if (!loadPatterns()) {
        delete[] patternValues;
        patternValues = nullptr;
        return false;
    };
    {
        // line 1 + 2X
        addDependency(9, 0);
        multipleAdd(0, 1, 8, 0);
        addDependency(14, 0);

        addDependency(49, 1);
        multipleAdd(56, -8, 8, 1);
        addDependency(9, 1);

        addDependency(54, 2);
        multipleAdd(63, -1, 8, 2);
        addDependency(49, 2);

        addDependency(14, 3);
        multipleAdd(7, 8, 8, 3);
        addDependency(54, 3);

        // line 2
        multipleAdd(8, 1, 8, 4);
        multipleAdd(57, -8, 8, 5);
        multipleAdd(55, -1, 8, 6);
        multipleAdd(6, 8, 8, 7);

        // line 3
        multipleAdd(16, 1, 8, 8);
        multipleAdd(58, -8, 8, 9);
        multipleAdd(47, -1, 8, 10);
        multipleAdd(5, 8, 8, 11);

        // line 4
        multipleAdd(24, 1, 8, 12);
        multipleAdd(59, -8, 8, 13);
        multipleAdd(39, -1, 8, 14);
        multipleAdd(4, 8, 8, 15);

        // diag 8
        multipleAdd(0, 9, 8, 16);
        multipleAdd(56, -7, 8, 17);

        // diag 7
        multipleAdd(8, 9, 7, 18);
        multipleAdd(57, -7, 7, 19);
        multipleAdd(55, -9, 7, 20);
        multipleAdd(6, 7, 7, 21);

        // diag 6
        multipleAdd(16, 9, 6, 22);
        multipleAdd(58, -7, 6, 23);
        multipleAdd(47, -9, 6, 24);
        multipleAdd(5, 7, 6, 25);

        // diag 5
        multipleAdd(24, 9, 5, 26);
        multipleAdd(59, -7, 5, 27);
        multipleAdd(39, -9, 5, 28);
        multipleAdd(4, 7, 5, 29);

        // diag 4
        multipleAdd(32, 9, 4, 30);
        multipleAdd(60, -7, 4, 31);
        multipleAdd(31, -9, 4, 32);
        multipleAdd(3, 7, 4, 33);

        // 2x5 square
        multipleAdd(0, 1, 5, 34);
        multipleAdd(8, 1, 5, 34);

        multipleAdd(56, -8, 5, 35);
        multipleAdd(57, -8, 5, 35);

        multipleAdd(63, -1, 5, 36);
        multipleAdd(55, -1, 5, 36);

        multipleAdd(7, 8, 5, 37);
        multipleAdd(6, 8, 5, 37);

        multipleAdd(0, 8, 5, 38);
        multipleAdd(1, 8, 5, 38);

        multipleAdd(56, 1, 5, 39);
        multipleAdd(48, 1, 5, 39);

        multipleAdd(63, -8, 5, 40);
        multipleAdd(62, -8, 5, 40);

        multipleAdd(7, -1, 5, 41);
        multipleAdd(15, -1, 5, 41);

        // 3x3 square
        multipleAdd(0, 1, 3, 42);
        multipleAdd(8, 1, 3, 42);
        multipleAdd(16, 1, 3, 42);

        multipleAdd(56, -8, 3, 43);
        multipleAdd(57, -8, 3, 43);
        multipleAdd(58, -8, 3, 43);

        multipleAdd(63, -1, 3, 44);
        multipleAdd(55, -1, 3, 44);
        multipleAdd(47, -1, 3, 44);

        multipleAdd(7, 8, 3, 45);
        multipleAdd(6, 8, 3, 45);
        multipleAdd(5, 8, 3, 45);
    }

    for (int i = 0; i < 256; i++)
        for (int j = 0; j < 8; j++)
            if (i & (1 << (7 - j)))
                for (int k = 0; k < 8; k++)
                    for (int l = 0; l < ACTUAL_PATTERNS; l++) {
                        myPV[i][k][l] += (unsigned short)posDepend[k * HEIGHT + j][l];
                    }
    for (int i = 0; i < 256; i++)
        for (int j = 0; j < 8; j++)
            for (int k = 0; k < ACTUAL_PATTERNS; k++)
                if (myPV[i][j][k] != 0) {
                    pPtr[i][j][pVCount[i][j]] = (unsigned char)k;
                    //opPV[i][j][pVCount[i][j]] = myPV[i][j][k] << 1;
                    myPV[i][j][pVCount[i][j]++] = myPV[i][j][k];
                }
    return true;
}